

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# components.hpp
# Opt level: O1

void __thiscall
cs::exception::exception(exception *this,size_t line,string *file,string *code,string *what)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  pointer pcVar2;
  undefined8 uVar3;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar4;
  string local_30;
  
  *(undefined ***)this = &PTR__exception_0025e4f0;
  this->mLine = line;
  paVar4 = &(this->mFile).field_2;
  (this->mFile)._M_dataplus._M_p = (pointer)paVar4;
  pcVar2 = (file->_M_dataplus)._M_p;
  paVar1 = &file->field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)pcVar2 == paVar1) {
    uVar3 = *(undefined8 *)((long)&file->field_2 + 8);
    paVar4->_M_allocated_capacity = paVar1->_M_allocated_capacity;
    *(undefined8 *)((long)&(this->mFile).field_2 + 8) = uVar3;
  }
  else {
    (this->mFile)._M_dataplus._M_p = pcVar2;
    paVar4->_M_allocated_capacity = paVar1->_M_allocated_capacity;
  }
  (this->mFile)._M_string_length = file->_M_string_length;
  (file->_M_dataplus)._M_p = (pointer)paVar1;
  file->_M_string_length = 0;
  (file->field_2)._M_local_buf[0] = '\0';
  paVar1 = &(this->mCode).field_2;
  (this->mCode)._M_dataplus._M_p = (pointer)paVar1;
  pcVar2 = (code->_M_dataplus)._M_p;
  paVar4 = &code->field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)pcVar2 == paVar4) {
    uVar3 = *(undefined8 *)((long)&code->field_2 + 8);
    paVar1->_M_allocated_capacity = paVar4->_M_allocated_capacity;
    *(undefined8 *)((long)&(this->mCode).field_2 + 8) = uVar3;
  }
  else {
    (this->mCode)._M_dataplus._M_p = pcVar2;
    paVar1->_M_allocated_capacity = paVar4->_M_allocated_capacity;
  }
  (this->mCode)._M_string_length = code->_M_string_length;
  (code->_M_dataplus)._M_p = (pointer)paVar4;
  code->_M_string_length = 0;
  (code->field_2)._M_local_buf[0] = '\0';
  paVar1 = &(this->mWhat).field_2;
  (this->mWhat)._M_dataplus._M_p = (pointer)paVar1;
  pcVar2 = (what->_M_dataplus)._M_p;
  paVar4 = &what->field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)pcVar2 == paVar4) {
    uVar3 = *(undefined8 *)((long)&what->field_2 + 8);
    paVar1->_M_allocated_capacity = paVar4->_M_allocated_capacity;
    *(undefined8 *)((long)&(this->mWhat).field_2 + 8) = uVar3;
  }
  else {
    (this->mWhat)._M_dataplus._M_p = pcVar2;
    paVar1->_M_allocated_capacity = paVar4->_M_allocated_capacity;
  }
  (this->mWhat)._M_string_length = what->_M_string_length;
  (what->_M_dataplus)._M_p = (pointer)paVar4;
  what->_M_string_length = 0;
  (what->field_2)._M_local_buf[0] = '\0';
  (this->mStr)._M_dataplus._M_p = (pointer)&(this->mStr).field_2;
  (this->mStr)._M_string_length = 0;
  (this->mStr).field_2._M_local_buf[0] = '\0';
  compose_what(&local_30,&this->mFile,this->mLine,&this->mCode,&this->mWhat);
  std::__cxx11::string::operator=((string *)&this->mStr,(string *)&local_30);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_30._M_dataplus._M_p != &local_30.field_2) {
    operator_delete(local_30._M_dataplus._M_p,local_30.field_2._M_allocated_capacity + 1);
  }
  return;
}

Assistant:

exception(std::size_t line, std::string file, std::string code, std::string what) noexcept:
			mLine(line), mFile(std::move(file)), mCode(std::move(code)), mWhat(std::move(what))
		{
			mStr = compose_what(mFile, mLine, mCode, mWhat);
		}